

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::BaseBuilder::newEmbedDataNode
          (BaseBuilder *this,EmbedDataNode **out,TypeId typeId,void *data,size_t itemCount,
          size_t repeatCount)

{
  EmbedDataNode EVar1;
  undefined1 auVar2 [16];
  char cVar3;
  Error EVar4;
  ulong size;
  EmbedDataNode *unaff_RBX;
  EmbedDataNode *__dest;
  size_t unaff_RBP;
  EmbedDataNode *pEVar5;
  EmbedDataNode *unaff_R15;
  EmbedDataNode **local_50;
  size_t local_48;
  size_t local_38;
  
  *out = (EmbedDataNode *)0x0;
  cVar3 = (((this->super_BaseEmitter)._environment._arch & k32BitMask) == kUnknown) * '\x02' +
          '\x06';
  if ((typeId & 0xfe) != _kBaseStart) {
    cVar3 = '\0';
  }
  if (0x44 < (byte)((cVar3 + typeId) - 0x20)) {
    EVar4 = 2;
LAB_001165ee:
    EVar4 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar4,(char *)0x0);
    return EVar4;
  }
  EVar1 = *(EmbedDataNode *)(TypeUtils::_typeData + (ulong)(byte)(cVar3 + typeId) + 0x100);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = itemCount;
  auVar2 = auVar2 * ZEXT116((byte)EVar1);
  size = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    EVar4 = 1;
    goto LAB_001165ee;
  }
  if (*(long *)&this->_allocator == 0) {
    newEmbedDataNode();
  }
  else {
    unaff_RBX = (EmbedDataNode *)ZoneAllocator::_alloc(&this->_allocator,0x80,&local_38);
    unaff_RBP = itemCount;
    unaff_R15 = unaff_RBX;
    local_50 = out;
    local_48 = repeatCount;
    if (unaff_RBX != (EmbedDataNode *)0x0) {
      *(undefined8 *)unaff_RBX = 0;
      *(undefined8 *)(unaff_RBX + 8) = 0;
      unaff_RBX[0x10] = (EmbedDataNode)0x5;
      unaff_RBX[0x11] = (EmbedDataNode)(this->_nodeFlags | kIsData);
      *(undefined8 *)(unaff_RBX + 0x14) = 0;
      *(undefined8 *)(unaff_RBX + 0x1c) = 0;
      *(undefined8 *)(unaff_RBX + 0x20) = 0;
      *(undefined8 *)(unaff_RBX + 0x28) = 0;
      *(undefined8 *)(unaff_RBX + 0x40) = 0;
      *(undefined8 *)(unaff_RBX + 0x48) = 0;
      *(undefined8 *)(unaff_RBX + 0x50) = 0;
      *(undefined8 *)(unaff_RBX + 0x58) = 0;
      *(undefined8 *)(unaff_RBX + 0x60) = 0;
      *(undefined8 *)(unaff_RBX + 0x68) = 0;
      *(undefined8 *)(unaff_RBX + 0x70) = 0;
      *(undefined8 *)(unaff_RBX + 0x78) = 0;
      goto LAB_00116538;
    }
  }
  EVar4 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
  if (EVar4 != 0) {
    return EVar4;
  }
LAB_00116538:
  unaff_R15[0x12] = (EmbedDataNode)typeId;
  unaff_R15[0x13] = EVar1;
  *(size_t *)(unaff_R15 + 0x30) = unaff_RBP;
  *(size_t *)(unaff_R15 + 0x38) = local_48;
  __dest = unaff_RBX + 0x40;
  if (0x40 < size) {
    pEVar5 = (EmbedDataNode *)(*(long *)&this->_dataZone + 7U & 0xfffffffffffffff8);
    if ((pEVar5 < *(EmbedDataNode **)&this->field_0xc0) &&
       (size <= (ulong)((long)*(EmbedDataNode **)&this->field_0xc0 - (long)pEVar5))) {
      *(EmbedDataNode **)&this->_dataZone = pEVar5 + size;
    }
    else {
      pEVar5 = (EmbedDataNode *)Zone::_alloc(&this->_dataZone,size,8);
    }
    if (pEVar5 == (EmbedDataNode *)0x0) {
      EVar4 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
      return EVar4;
    }
    *(EmbedDataNode **)__dest = pEVar5;
    __dest = pEVar5;
  }
  if (data != (void *)0x0) {
    memcpy(__dest,data,size);
  }
  *local_50 = unaff_R15;
  return 0;
}

Assistant:

Error BaseBuilder::newEmbedDataNode(EmbedDataNode** out, TypeId typeId, const void* data, size_t itemCount, size_t repeatCount) {
  *out = nullptr;

  uint32_t deabstractDelta = TypeUtils::deabstractDeltaOfSize(registerSize());
  TypeId finalTypeId = TypeUtils::deabstract(typeId, deabstractDelta);

  if (ASMJIT_UNLIKELY(!TypeUtils::isValid(finalTypeId)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  uint32_t typeSize = TypeUtils::sizeOf(finalTypeId);
  Support::FastUInt8 of = 0;

  size_t dataSize = Support::mulOverflow(itemCount, size_t(typeSize), &of);
  if (ASMJIT_UNLIKELY(of))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  EmbedDataNode* node;
  ASMJIT_PROPAGATE(_newNodeT<EmbedDataNode>(&node));

  node->_embed._typeId = typeId;
  node->_embed._typeSize = uint8_t(typeSize);
  node->_itemCount = itemCount;
  node->_repeatCount = repeatCount;

  uint8_t* dstData = node->_inlineData;
  if (dataSize > EmbedDataNode::kInlineBufferSize) {
    dstData = static_cast<uint8_t*>(_dataZone.alloc(dataSize, 8));
    if (ASMJIT_UNLIKELY(!dstData))
      return reportError(DebugUtils::errored(kErrorOutOfMemory));
    node->_externalData = dstData;
  }

  if (data)
    memcpy(dstData, data, dataSize);

  *out = node;
  return kErrorOk;
}